

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

xmlOutputBufferPtr xmlOutputBufferCreatePythonFile(PyObject *file,xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr ret;
  xmlCharEncodingHandlerPtr encoder_local;
  PyObject *file_local;
  
  if (file == (PyObject *)0x0) {
    file_local = (PyObject *)0x0;
  }
  else {
    file_local = (PyObject *)xmlAllocOutputBuffer(encoder);
    if (file_local != (PyObject *)0x0) {
      file_local->ob_refcnt = (Py_ssize_t)file;
      file_local->ob_type = (PyTypeObject *)xmlPythonFileWrite;
      file_local[1].ob_refcnt = (Py_ssize_t)xmlPythonFileClose;
    }
  }
  return (xmlOutputBufferPtr)file_local;
}

Assistant:

static xmlOutputBufferPtr
xmlOutputBufferCreatePythonFile(PyObject *file, 
	                        xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (file == NULL) return(NULL);

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        ret->context = file;
	/* Py_INCREF(file); */
	ret->writecallback = xmlPythonFileWrite;
	ret->closecallback = xmlPythonFileClose;
    }

    return(ret);
}